

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferActiveUniformValidation.cpp
# Opt level: O3

TextureParameters * __thiscall
glcts::TextureBufferActiveUniformValidation::getParamsForType
          (TextureBufferActiveUniformValidation *this,GLenum uniformType)

{
  pointer pTVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  pTVar1 = (this->m_texture_params).
           super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(this->m_texture_params).
                super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1;
  if (lVar2 == 0) {
    return (TextureParameters *)0x0;
  }
  uVar3 = (lVar2 >> 4) * -0x5555555555555555;
  uVar4 = 1;
  uVar5 = 0;
  do {
    if (pTVar1[uVar5].m_texture_uniform_type == uniformType) {
      return pTVar1 + uVar5;
    }
    uVar5 = (ulong)uVar4;
    uVar4 = uVar4 + 1;
  } while (uVar5 <= uVar3 && uVar3 - uVar5 != 0);
  return (TextureParameters *)0x0;
}

Assistant:

const TextureParameters* TextureBufferActiveUniformValidation::getParamsForType(glw::GLenum uniformType) const
{
	for (glw::GLuint i = 0; i < m_texture_params.size(); ++i)
	{
		if (m_texture_params[i].get_texture_uniform_type() == uniformType)
		{
			return &m_texture_params[i];
		}
	}
	return DE_NULL;
}